

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O3

Gia_Man_t * Gia_ManFalseRebuild(Gia_Man_t *p,Vec_Wec_t *vHooks,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  int iVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Gia_Man_t *pGVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  p_00 = Gia_ManStart((p->nObjs << 2) / 3);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  if (1 < p->nObjs) {
    lVar13 = 1;
    lVar14 = 0x14;
    lVar15 = 0x10;
    uVar12 = 0;
    do {
      pGVar3 = p->pObjs;
      uVar4 = *(ulong *)((long)pGVar3 + lVar14 + -8);
      uVar6 = (uint)uVar4;
      iVar7 = (int)(uVar4 & 0x1fffffff);
      if ((uVar4 & 0x1fffffff) == 0x1fffffff || (int)uVar6 < 0) {
        if ((uVar6 & 0x9fffffff) == 0x9fffffff) {
          pGVar10 = Gia_ManAppendObj(p_00);
          uVar4 = *(ulong *)pGVar10;
          *(ulong *)pGVar10 = uVar4 | 0x9fffffff;
          *(ulong *)pGVar10 =
               uVar4 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar5 = p_00->pObjs;
          if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) {
LAB_00741e90:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
          pGVar5 = p_00->pObjs;
          if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00741e90;
          *(int *)(&pGVar3->field_0x0 + lVar14) =
               (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556;
        }
        else if ((int)uVar6 < 0 && iVar7 != 0x1fffffff) {
          uVar1 = *(uint *)((long)pGVar3 + lVar14 + (ulong)(uint)(iVar7 << 2) * -3);
          if ((int)uVar1 < 0) goto LAB_00741ece;
          iVar7 = Gia_ManAppendCo(p_00,uVar1 ^ uVar6 >> 0x1d & 1);
          goto LAB_00741e1e;
        }
      }
      else {
        if (vHooks->nSize <= lVar13) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0xd3,"int Vec_WecLevelSize(Vec_Wec_t *, int)");
        }
        if (*(int *)((long)&vHooks->pArray->nSize + lVar15) < 1) {
          uVar6 = *(uint *)((long)pGVar3 + lVar14 + (ulong)(uint)(iVar7 << 2) * -3);
          if (((int)uVar6 < 0) ||
             (uVar1 = *(uint *)((long)pGVar3 +
                               lVar14 + (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3),
             (int)uVar1 < 0)) {
LAB_00741ece:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          iVar7 = Gia_ManHashAnd(p_00,uVar6 ^ (uint)(uVar4 >> 0x1d) & 1,
                                 uVar1 ^ (uint)(uVar4 >> 0x3d) & 1);
LAB_00741e1e:
          *(int *)(&pGVar3->field_0x0 + lVar14) = iVar7;
        }
        else if (fVeryVerbose == 0) {
          Gia_ManFalseRebuildOne(p_00,p,(Vec_Int_t *)((long)&vHooks->pArray->nCap + lVar15),iVar7,0)
          ;
        }
        else {
          printf("Path %d : ",(ulong)uVar12);
          if (vHooks->nSize <= lVar13) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          uVar12 = uVar12 + 1;
          Gia_ManFalseRebuildOne
                    (p_00,p,(Vec_Int_t *)((long)&vHooks->pArray->nCap + lVar15),(int)vHooks,
                     fVeryVerbose);
        }
      }
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0xc;
      lVar15 = lVar15 + 0x10;
    } while (lVar13 < p->nObjs);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar11 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar11;
}

Assistant:

Gia_Man_t * Gia_ManFalseRebuild( Gia_Man_t * p, Vec_Wec_t * vHooks, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    pNew = Gia_ManStart( 4 * Gia_ManObjNum(p) / 3 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( Vec_WecLevelSize(vHooks, i) > 0 )
            {
                if ( fVeryVerbose )
                    printf( "Path %d : ", Counter++ );
                Gia_ManFalseRebuildOne( pNew, p, Vec_WecEntry(vHooks, i), fVerbose, fVeryVerbose );
            }
            else
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        }
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}